

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

int * Abc_NtkOutputMiniMapping(Abc_Frame_t *pAbc)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Vec_Int_t *p;
  int *piVar2;
  int *pArray;
  Vec_Int_t *vMapping;
  Abc_Ntk_t *pNtk;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    printf("Current network in ABC framework is not defined.\n");
  }
  iVar1 = Abc_NtkHasMapping(pNtk_00);
  if (iVar1 == 0) {
    printf("Current network in ABC framework is not mapped.\n");
  }
  p = Abc_NtkWriteMiniMapping(pNtk_00);
  piVar2 = Vec_IntArray(p);
  if (p != (Vec_Int_t *)0x0) {
    free(p);
  }
  return piVar2;
}

Assistant:

int * Abc_NtkOutputMiniMapping( Abc_Frame_t * pAbc )
{
    //Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vMapping;
    int * pArray;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    if ( !Abc_NtkHasMapping(pNtk) )
        printf( "Current network in ABC framework is not mapped.\n" );
    // derive mini-mapping
    vMapping = Abc_NtkWriteMiniMapping( pNtk );
    pArray = Vec_IntArray( vMapping );
    ABC_FREE( vMapping );
    // print mini-mapping (optional)
//    Abc_NtkPrintMiniMapping( pArray );
    // return the array representation of mini-mapping
    return pArray;
}